

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  char cVar1;
  int in_EAX;
  int extraout_EAX;
  uint *puVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uchar chain [16];
  uchar tmp [48];
  uchar key [32];
  uchar buf [416];
  mbedtls_aes_context aes_ctx;
  undefined8 local_368;
  undefined8 uStack_360;
  uchar *local_358;
  ulong local_350;
  uchar local_348 [8];
  undefined8 auStack_340 [3];
  undefined8 local_328;
  undefined8 uStack_320;
  uchar local_318 [32];
  undefined4 local_2f8;
  uint auStack_2f4 [3];
  undefined2 local_2e8;
  undefined1 local_2e6;
  undefined1 local_2e5;
  undefined1 local_2e1;
  undefined1 local_2e0 [400];
  mbedtls_aes_context local_150;
  
  if (data_len < 0x181) {
    local_358 = output;
    memset(&local_2f8,0,0x1a0);
    mbedtls_aes_init(&local_150);
    local_2e8 = 0;
    local_2e6 = (undefined1)(data_len >> 8);
    local_2e5 = (undefined1)data_len;
    local_2e1 = 0x30;
    memcpy(local_2e0,data,data_len);
    local_2e0[data_len] = 0x80;
    local_318[0] = '\0';
    local_318[1] = '\x01';
    local_318[2] = '\x02';
    local_318[3] = '\x03';
    local_318[4] = '\x04';
    local_318[5] = '\x05';
    local_318[6] = '\x06';
    local_318[7] = '\a';
    local_318[8] = '\b';
    local_318[9] = '\t';
    local_318[10] = '\n';
    local_318[0xb] = '\v';
    local_318[0xc] = '\f';
    local_318[0xd] = '\r';
    local_318[0xe] = '\x0e';
    local_318[0xf] = '\x0f';
    local_318[0x10] = '\x10';
    local_318[0x11] = '\x11';
    local_318[0x12] = '\x12';
    local_318[0x13] = '\x13';
    local_318[0x14] = '\x14';
    local_318[0x15] = '\x15';
    local_318[0x16] = '\x16';
    local_318[0x17] = '\x17';
    local_318[0x18] = '\x18';
    local_318[0x19] = '\x19';
    local_318[0x1a] = '\x1a';
    local_318[0x1b] = '\x1b';
    local_318[0x1c] = '\x1c';
    local_318[0x1d] = '\x1d';
    local_318[0x1e] = '\x1e';
    local_318[0x1f] = '\x1f';
    mbedtls_aes_setkey_enc(&local_150,local_318,0x100);
    local_350 = data_len + 0x29;
    uVar5 = 0;
    do {
      cVar1 = local_2f8._3_1_;
      local_368 = 0;
      uStack_360 = 0;
      puVar2 = &local_2f8;
      uVar6 = local_350;
      do {
        local_368 = CONCAT44(puVar2[1] ^ local_368._4_4_,*puVar2 ^ (uint)local_368);
        uStack_360 = CONCAT44(puVar2[3] ^ uStack_360._4_4_,puVar2[2] ^ (uint)uStack_360);
        puVar2 = puVar2 + 4;
        mbedtls_aes_crypt_ecb(&local_150,1,(uchar *)&local_368,(uchar *)&local_368);
        uVar6 = uVar6 - 0x10;
      } while (0x10 < uVar6);
      *(undefined8 *)((long)auStack_340 + (uVar5 - 8)) = local_368;
      *(undefined8 *)((long)auStack_340 + uVar5) = uStack_360;
      local_2f8._3_1_ = cVar1 + '\x01';
      bVar7 = uVar5 < 0x20;
      uVar5 = uVar5 + 0x10;
    } while (bVar7);
    mbedtls_aes_setkey_enc(&local_150,local_348,0x100);
    uVar4 = 0xfffffff0;
    puVar3 = local_358;
    do {
      mbedtls_aes_crypt_ecb(&local_150,1,(uchar *)&local_328,(uchar *)&local_328);
      *(undefined8 *)puVar3 = local_328;
      *(undefined8 *)(puVar3 + 8) = uStack_320;
      puVar3 = puVar3 + 0x10;
      uVar4 = uVar4 + 0x10;
    } while (uVar4 < 0x20);
    mbedtls_aes_free(&local_150);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    mbedtls_aes_setkey_enc( &aes_ctx, key, MBEDTLS_CTR_DRBG_KEYBITS );

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, chain, chain );
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    mbedtls_aes_setkey_enc( &aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS );
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    mbedtls_aes_free( &aes_ctx );

    return( 0 );
}